

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

void __thiscall
cfd::core::AbstractTransaction::SetUnlockingScript
          (AbstractTransaction *this,uint32_t tx_in_index,Script *unlocking_script)

{
  wally_tx *tx;
  bool bVar1;
  CfdException *pCVar2;
  undefined4 in_register_00000034;
  int ret;
  int local_64;
  undefined1 local_60 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  (*this->_vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),399,"SetUnlockingScript");
  bVar1 = Script::IsPushOnly(unlocking_script);
  if (!bVar1) {
    local_60._0_8_ = "cfdcore_transaction_common.cpp";
    local_60._8_4_ = 0x191;
    local_60._16_8_ = "SetUnlockingScript";
    logger::log<>((CfdSourceLocation *)local_60,kCfdLogLevelWarning,"IsPushOnly() false.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_60._0_8_ = local_60 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,
               "unlocking script error. The script needs to be push operator only.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  tx = (wally_tx *)this->wally_tx_pointer_;
  Script::GetData((ByteData *)local_60,unlocking_script);
  ByteData::GetBytes(&local_40,(ByteData *)local_60);
  if ((pointer)local_60._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_60._0_8_);
  }
  local_64 = wally_tx_set_input_script
                       (tx,(ulong)tx_in_index,
                        local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  if (local_64 == 0) {
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_60._0_8_ = "cfdcore_transaction_common.cpp";
  local_60._8_4_ = 0x19e;
  local_60._16_8_ = "SetUnlockingScript";
  logger::log<int&>((CfdSourceLocation *)local_60,kCfdLogLevelWarning,
                    "wally_tx_set_input_script NG[{}].",&local_64);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_60._0_8_ = local_60 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"unlocking script setting error.","");
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_60);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::SetUnlockingScript(
    uint32_t tx_in_index, const Script &unlocking_script) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);
  if (!unlocking_script.IsPushOnly()) {
    warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "unlocking script error. "
        "The script needs to be push operator only.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &arrays = unlocking_script.GetData().GetBytes();
  int ret = wally_tx_set_input_script(
      tx_pointer, tx_in_index, arrays.data(), arrays.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_set_input_script NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unlocking script setting error.");
  }
}